

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall
spv::Builder::accessChainPushSwizzle
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *swizzle,
          Id preSwizzleBaseType,CoherentFlags coherentFlags,uint alignment)

{
  uint *puVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator __position;
  bool bVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oldSwizzle;
  CoherentFlags local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_3c = coherentFlags;
  AccessChain::CoherentFlags::operator|=(&(this->accessChain).coherentFlags,&local_3c);
  puVar1 = &(this->accessChain).alignment;
  *puVar1 = *puVar1 | alignment;
  if ((this->accessChain).preSwizzleBaseType == 0) {
    (this->accessChain).preSwizzleBaseType = preSwizzleBaseType;
  }
  this_00 = &(this->accessChain).swizzle;
  if ((this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_00,swizzle);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_00,0);
    puVar3 = (swizzle->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((swizzle->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        if ((ulong)((long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) <= (ulong)puVar3[uVar4]) {
          __assert_fail("swizzle[i] < oldSwizzle.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                        ,0xf7a,
                        "void spv::Builder::accessChainPushSwizzle(std::vector<unsigned int> &, Id, AccessChain::CoherentFlags, unsigned int)"
                       );
        }
        __position._M_current =
             (this->accessChain).swizzle.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->accessChain).swizzle.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,__position,
                     local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + puVar3[uVar4]);
          puVar3 = (swizzle->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *__position._M_current =
               local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[puVar3[uVar4]];
          (this->accessChain).swizzle.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        bVar2 = uVar5 < (ulong)((long)(swizzle->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >>
                               2);
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar2);
    }
    if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  simplifyAccessChainSwizzle(this);
  return;
}

Assistant:

void Builder::accessChainPushSwizzle(std::vector<unsigned>& swizzle, Id preSwizzleBaseType,
    AccessChain::CoherentFlags coherentFlags, unsigned int alignment)
{
    accessChain.coherentFlags |= coherentFlags;
    accessChain.alignment |= alignment;

    // swizzles can be stacked in GLSL, but simplified to a single
    // one here; the base type doesn't change
    if (accessChain.preSwizzleBaseType == NoType)
        accessChain.preSwizzleBaseType = preSwizzleBaseType;

    // if needed, propagate the swizzle for the current access chain
    if (accessChain.swizzle.size() > 0) {
        std::vector<unsigned> oldSwizzle = accessChain.swizzle;
        accessChain.swizzle.resize(0);
        for (unsigned int i = 0; i < swizzle.size(); ++i) {
            assert(swizzle[i] < oldSwizzle.size());
            accessChain.swizzle.push_back(oldSwizzle[swizzle[i]]);
        }
    } else
        accessChain.swizzle = swizzle;

    // determine if we need to track this swizzle anymore
    simplifyAccessChainSwizzle();
}